

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uxsel.c
# Opt level: O0

void uxsel_del(int fd)

{
  void *e;
  fd *oldfd;
  int fd_local;
  
  oldfd._4_4_ = fd;
  e = find234(fds,(void *)((long)&oldfd + 4),uxsel_fd_findcmp);
  if (e != (void *)0x0) {
    if (*(long *)((long)e + 0x10) != 0) {
      uxsel_input_remove(*(uxsel_id **)((long)e + 0x10));
    }
    del234(fds,e);
    safefree(e);
  }
  return;
}

Assistant:

void uxsel_del(int fd)
{
    struct fd *oldfd = find234(fds, &fd, uxsel_fd_findcmp);
    if (oldfd) {
        if (oldfd->id)
            uxsel_input_remove(oldfd->id);
        del234(fds, oldfd);
        sfree(oldfd);
    }
}